

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.h
# Opt level: O3

IRBuiltinHandler * __thiscall flow::IRProgram::getBuiltinHandler(IRProgram *this,NativeCallback *cb)

{
  vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
  *this_00;
  bool bVar1;
  Signature *pSVar2;
  Signature *v;
  tuple<flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_> this_01;
  pointer puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  __uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_> local_40;
  IRProgram *local_38;
  
  this_00 = &this->builtinHandlers_;
  lVar6 = (long)(this->builtinHandlers_).
                super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->builtinHandlers_).
                super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38 = this;
  if (lVar6 != 0) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      pSVar2 = NativeCallback::signature
                         (*(NativeCallback **)
                           ((long)(this_00->
                                  super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                                  super___uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
                           + 0x48));
      v = NativeCallback::signature(cb);
      bVar1 = Signature::operator==(pSVar2,v);
      if (bVar1) {
        puVar3 = (pointer)((long)(this_00->
                                 super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start - lVar5);
        goto LAB_00116ccb;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar6 >> 3 != lVar4);
  }
  this_01.
  super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>.
  super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>)
       operator_new(0x50);
  pSVar2 = NativeCallback::signature(cb);
  Value::Value((Value *)this_01.
                        super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
                        .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl,Boolean
               ,&pSVar2->name_);
  *(undefined ***)
   this_01.
   super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>.
   super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl = &PTR__Value_0019b330;
  ((Value *)
  ((long)this_01.
         super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
         .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl + 0x48))->_vptr_Value
       = (_func_int **)cb;
  local_40._M_t.
  super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>.
  super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl =
       (tuple<flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>)
       (tuple<flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>)
       this_01.
       super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
       .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>,std::allocator<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>>
  ::
  emplace_back<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>
            ((vector<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>,std::allocator<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>>
              *)this_00,
             (unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_> *)
             &local_40);
  if ((_Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
      .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl !=
      (IRBuiltinHandler *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
                          .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl + 8))
              ();
  }
  puVar3 = (local_38->builtinHandlers_).
           super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00116ccb:
  return (puVar3->_M_t).
         super___uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
         .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl;
}

Assistant:

IRBuiltinHandler* getBuiltinHandler(const NativeCallback& cb) {
    for (size_t i = 0, e = builtinHandlers_.size(); i != e; ++i)
      if (builtinHandlers_[i]->signature() == cb.signature())
        return builtinHandlers_[i].get();

    builtinHandlers_.emplace_back(std::make_unique<IRBuiltinHandler>(cb));
    return builtinHandlers_.back().get();
  }